

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O2

void mp::WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,PLConParams *plp)

{
  PLPoints *pPVar1;
  BasicWriter<char> *pBVar2;
  size_t i;
  ulong uVar3;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  
  value.size_ = 9;
  value.data_ = "plpoints[";
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
  pPVar1 = PLConParams::GetPLPoints(plp);
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(pPVar1->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)(pPVar1->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    if (uVar3 != 0) {
      value_00.size_ = 2;
      value_00.data_ = ", ";
      fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_00);
    }
    pBVar2 = fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,'(');
    pBVar2 = fmt::BasicWriter<char>::operator<<
                       (pBVar2,(pPVar1->x_).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar3]);
    value_01.size_ = 2;
    value_01.data_ = ", ";
    pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,value_01);
    pBVar2 = fmt::BasicWriter<char>::operator<<
                       (pBVar2,(pPVar1->y_).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar3]);
    fmt::BasicWriter<char>::operator<<(pBVar2,')');
  }
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,']');
  return;
}

Assistant:

void WriteModelItemParameters(
    Writer& wrt, const PLConParams& plp) {
  wrt << "plpoints[";
  const auto& p = plp.GetPLPoints();
  for (size_t i=0; i<p.x_.size(); ++i) {
    if (i)
      wrt << ", ";
    wrt << '(' << p.x_[i] << ", " << p.y_[i] << ')';
  }
  wrt << ']';
}